

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checkbox.cpp
# Opt level: O1

bool __thiscall ftxui::anon_unknown_3::CheckboxBase::OnEvent(CheckboxBase *this,Event *event)

{
  undefined8 uVar1;
  pointer pcVar2;
  CheckboxOption *pCVar3;
  ComponentBase *__n;
  Button BVar4;
  Motion MVar5;
  bool bVar6;
  int iVar7;
  CheckboxOption *pCVar8;
  int local_98;
  int iStack_94;
  long *local_90 [2];
  long local_80 [2];
  ScreenInteractive *local_70;
  Event local_60;
  
  if (event->type_ != Mouse) {
    Event::Character(&local_60,' ');
    __n = (ComponentBase *)(event->input_)._M_string_length;
    if ((__n == (ComponentBase *)local_60.input_._M_string_length) &&
       ((__n == (ComponentBase *)0x0 ||
        (iVar7 = bcmp((event->input_)._M_dataplus._M_p,local_60.input_._M_dataplus._M_p,(size_t)__n)
        , iVar7 == 0)))) {
      if (local_60.input_._M_dataplus._M_p != (pointer)((long)&local_60 + 0x28U)) {
        operator_delete(local_60.input_._M_dataplus._M_p,
                        local_60.input_.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      bVar6 = Event::operator==(event,(Event *)Event::Return);
      if (local_60.input_._M_dataplus._M_p != (pointer)((long)&local_60 + 0x28U)) {
        operator_delete(local_60.input_._M_dataplus._M_p,
                        local_60.input_.field_2._M_allocated_capacity + 1);
      }
      if (!bVar6) {
        return false;
      }
    }
    *this->state_ = (bool)(*this->state_ ^ 1);
    pCVar3 = (this->option_).address_;
    pCVar8 = &(this->option_).owned_;
    if (pCVar3 != (CheckboxOption *)0x0) {
      pCVar8 = pCVar3;
    }
    if ((pCVar8->on_change).super__Function_base._M_manager != (_Manager_type)0x0) {
      (*(pCVar8->on_change)._M_invoker)((_Any_data *)&pCVar8->on_change);
      return true;
    }
    std::__throw_bad_function_call();
  }
  uVar1 = *(undefined8 *)((long)&event->field_1 + 0xc);
  BVar4 = (event->field_1).mouse_.button;
  MVar5 = (event->field_1).mouse_.motion;
  pcVar2 = (event->input_)._M_dataplus._M_p;
  local_90[0] = local_80;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_90,pcVar2,pcVar2 + (event->input_)._M_string_length);
  local_70 = event->screen_;
  ComponentBase::CaptureMouse((ComponentBase *)&local_60,(Event *)this);
  if ((_func_int **)local_60._0_8_ != (_func_int **)0x0) {
    (**(code **)(*(_func_int **)local_60._0_8_ + 8))();
    local_98 = (int)uVar1;
    iStack_94 = (int)((ulong)uVar1 >> 0x20);
    bVar6 = Box::Contain(&this->box_,local_98,iStack_94);
    if (bVar6) {
      ComponentBase::TakeFocus(&this->super_ComponentBase);
      bVar6 = false;
      if ((BVar4 == Left) && (bVar6 = false, MVar5 == Pressed)) {
        *this->state_ = (bool)(*this->state_ ^ 1);
        pCVar3 = (this->option_).address_;
        pCVar8 = &(this->option_).owned_;
        if (pCVar3 != (CheckboxOption *)0x0) {
          pCVar8 = pCVar3;
        }
        if ((pCVar8->on_change).super__Function_base._M_manager == (_Manager_type)0x0) {
          std::__throw_bad_function_call();
        }
        bVar6 = true;
        (*(pCVar8->on_change)._M_invoker)((_Any_data *)&pCVar8->on_change);
      }
      goto LAB_0013b3bc;
    }
  }
  bVar6 = false;
LAB_0013b3bc:
  if (local_90[0] != local_80) {
    operator_delete(local_90[0],local_80[0] + 1);
  }
  return bVar6;
}

Assistant:

bool OnEvent(Event event) override {
    if (event.is_mouse())
      return OnMouseEvent(event);

    if (event == Event::Character(' ') || event == Event::Return) {
      *state_ = !*state_;
      option_->on_change();
      return true;
    }
    return false;
  }